

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *count_00;
  Vector *in_RDX;
  idx_t in_RSI;
  ValidityMask *in_RDI;
  ValidityMask *unaff_retaddr;
  ValidityMask *result_validity;
  uhugeint_t *result_data;
  uhugeint_t *rdata;
  uhugeint_t *ldata;
  bool in_stack_000000bf;
  ValidityMask *in_stack_000000c0;
  idx_t in_stack_000000c8;
  uhugeint_t *in_stack_000000d0;
  uhugeint_t *in_stack_000000d8;
  uhugeint_t *in_stack_000000e0;
  ValidityMask *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffb8;
  VectorType vector_type_p;
  TemplatedValidityMask<unsigned_long> *other;
  Vector *in_stack_ffffffffffffffc0;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x1281bfb);
  FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x1281c0a);
  Vector::SetVectorType(in_stack_ffffffffffffffc0,vector_type_p);
  this = (TemplatedValidityMask<unsigned_long> *)
         FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x1281c25);
  count_00 = &FlatVector::Validity((Vector *)0x1281c34)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
  if (bVar1) {
    other = count_00;
    FlatVector::Validity((Vector *)0x1281c5b);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0x1281c91);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0x1281cb9);
      ValidityMask::Combine(unaff_retaddr,in_RDI,in_RSI);
    }
  }
  else {
    FlatVector::Validity((Vector *)0x1281ce1);
    FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff88);
    FlatVector::Validity((Vector *)0x1281d02);
    ValidityMask::Combine(unaff_retaddr,in_RDI,in_RSI);
  }
  ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,false>
            (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
             in_stack_000000c0,in_stack_000000bf);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}